

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O2

uint32_t FACTWaveBank_Stop(FACTWaveBank *pWaveBank,uint16_t nWaveIndex,uint32_t dwFlags)

{
  FACTWaveBank *pFVar1;
  
  if (pWaveBank != (FACTWaveBank *)0x0) {
    FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);
    pFVar1 = pWaveBank;
    while (pFVar1 = (FACTWaveBank *)pFVar1->waveList, pFVar1 != (FACTWaveBank *)0x0) {
      if (*(uint16_t *)&pFVar1->parentEngine->pReadFile == nWaveIndex) {
        FACTWave_Stop((FACTWave *)pFVar1->parentEngine,dwFlags);
      }
    }
    FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
    return 0;
  }
  return 1;
}

Assistant:

uint32_t FACTWaveBank_Stop(
	FACTWaveBank *pWaveBank,
	uint16_t nWaveIndex,
	uint32_t dwFlags
) {
	FACTWave *wave;
	LinkedList *list;
	if (pWaveBank == NULL)
	{
		return 1;
	}
	FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);
	list = pWaveBank->waveList;
	while (list != NULL)
	{
		wave = (FACTWave*) list->entry;
		if (wave->index == nWaveIndex)
		{
			FACTWave_Stop(wave, dwFlags);
		}
		list = list->next;
	}
	FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
	return 0;
}